

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icmax1.c
# Opt level: O1

int icmax1_slu(int *n,singlecomplex *cx,int *incx)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar5;
  singlecomplex *psVar6;
  uint uVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  ulong uVar4;
  
  uVar1 = *n;
  if ((int)uVar1 < 1) {
    return 0;
  }
  uVar4 = 1;
  uVar3 = 1;
  if (uVar1 != 1) {
    iVar2 = *incx;
    if ((long)iVar2 == 1) {
      fVar9 = ABS(cx->r);
      uVar5 = 2;
      do {
        fVar10 = ABS(cx[uVar5 - 1].r);
        if (fVar9 < fVar10) {
          uVar4 = uVar5 & 0xffffffff;
        }
        uVar3 = (uint)uVar4;
        fVar9 = (float)(~-(uint)(fVar9 < fVar10) & (uint)fVar9 |
                       (uint)fVar10 & -(uint)(fVar9 < fVar10));
        uVar5 = uVar5 + 1;
      } while ((ulong)uVar1 + 1 != uVar5);
    }
    else {
      fVar9 = ABS(cx->r);
      psVar6 = cx + (long)(iVar2 + 1) + -1;
      uVar3 = 1;
      uVar7 = 2;
      do {
        fVar10 = ABS(psVar6->r);
        if (fVar9 < fVar10) {
          uVar3 = uVar7;
        }
        fVar9 = (float)(~-(uint)(fVar9 < fVar10) & (uint)fVar9 |
                       (uint)fVar10 & -(uint)(fVar9 < fVar10));
        psVar6 = psVar6 + iVar2;
        bVar8 = uVar7 != uVar1;
        uVar7 = uVar7 + 1;
      } while (bVar8);
    }
  }
  return uVar3;
}

Assistant:

int icmax1_slu(int *n, singlecomplex *cx, int *incx)
{
/*
       NEXT LINE IS THE ONLY MODIFICATION.   

    
   Parameter adjustments   
       Function Body */
    /* System generated locals */
    int ret_val;
    float r__1;
    /* Local variables */
    float smax;
    int i, ix;


#define CX(I) cx[(I)-1]


    ret_val = 0;
    if (*n < 1) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L30;
    }

/*     CODE FOR INCREMENT NOT EQUAL TO 1 */

    ix = 1;
    smax = (r__1 = CX(1).r, fabs(r__1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if ((r__1 = CX(ix).r, fabs(r__1)) <= smax) {
	    goto L10;
	}
	ret_val = i;
	smax = (r__1 = CX(ix).r, fabs(r__1));
L10:
	ix += *incx;
/* L20: */
    }
    return ret_val;

/*     CODE FOR INCREMENT EQUAL TO 1 */

L30:
    smax = (r__1 = CX(1).r, fabs(r__1));
    for (i = 2; i <= *n; ++i) {
	if ((r__1 = CX(i).r, fabs(r__1)) <= smax) {
	    goto L40;
	}
	ret_val = i;
	smax = (r__1 = CX(i).r, fabs(r__1));
L40:
	;
    }
    return ret_val;

/*     End of ICMAX1 */

}